

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionElasticPdu.cpp
# Opt level: O1

void __thiscall DIS::CollisionElasticPdu::marshal(CollisionElasticPdu *this,DataStream *dataStream)

{
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::marshal(&this->_issuingEntityID,dataStream);
  EntityID::marshal(&this->_collidingEntityID,dataStream);
  EventID::marshal(&this->_collisionEventID,dataStream);
  DataStream::operator<<(dataStream,this->_pad);
  Vector3Float::marshal(&this->_contactVelocity,dataStream);
  DataStream::operator<<(dataStream,this->_mass);
  Vector3Float::marshal(&this->_location,dataStream);
  DataStream::operator<<(dataStream,this->_collisionResultXX);
  DataStream::operator<<(dataStream,this->_collisionResultXY);
  DataStream::operator<<(dataStream,this->_collisionResultXZ);
  DataStream::operator<<(dataStream,this->_collisionResultYY);
  DataStream::operator<<(dataStream,this->_collisionResultYZ);
  DataStream::operator<<(dataStream,this->_collisionResultZZ);
  Vector3Float::marshal(&this->_unitSurfaceNormal,dataStream);
  DataStream::operator<<(dataStream,this->_coefficientOfRestitution);
  return;
}

Assistant:

void CollisionElasticPdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _issuingEntityID.marshal(dataStream);
    _collidingEntityID.marshal(dataStream);
    _collisionEventID.marshal(dataStream);
    dataStream << _pad;
    _contactVelocity.marshal(dataStream);
    dataStream << _mass;
    _location.marshal(dataStream);
    dataStream << _collisionResultXX;
    dataStream << _collisionResultXY;
    dataStream << _collisionResultXZ;
    dataStream << _collisionResultYY;
    dataStream << _collisionResultYZ;
    dataStream << _collisionResultZZ;
    _unitSurfaceNormal.marshal(dataStream);
    dataStream << _coefficientOfRestitution;
}